

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O1

vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
* google::protobuf::compiler::cpp::ParseFunctionGenerator::BuildFieldOptions
            (vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *__return_storage_ptr__,Descriptor *descriptor,
            Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields,Options *options,
            MessageSCCAnalyzer *scc_analyzer,Span<const_int> has_bit_indices,
            Span<const_int> inlined_string_indices)

{
  FieldDescriptor *field;
  iterator __position;
  bool bVar1;
  FieldDescriptor **ppFVar2;
  optional<float> oVar3;
  Nonnull<const_char_*> failure_msg;
  int iVar4;
  size_type __n;
  ulong uVar5;
  size_type sVar6;
  FieldOptions local_80;
  pointer local_60;
  pointer local_58;
  size_type local_50;
  size_type local_48;
  size_type local_40;
  pointer local_38;
  
  __n = ordered_fields.len_;
  local_38 = ordered_fields.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(__return_storage_ptr__,__n);
  if (__n != 0) {
    local_58 = has_bit_indices.ptr_;
    local_40 = has_bit_indices.len_;
    local_60 = inlined_string_indices.ptr_;
    local_48 = inlined_string_indices.len_;
    sVar6 = 0;
    local_50 = __n;
    do {
      field = local_38[sVar6];
      if ((field->field_0x1 & 8) == 0) {
        ppFVar2 = &field->containing_type_->fields_;
      }
      else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar2 = &field->file_->extensions_;
      }
      else {
        ppFVar2 = &((field->scope_).extension_scope)->extensions_;
      }
      iVar4 = (int)((long)field - (long)*ppFVar2 >> 3) * -0x45d1745d;
      if (iVar4 < 0) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((long)iVar4,0,"field->index() >= 0");
      }
      else {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
                   ,0x59,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_80);
      }
      if ((field->field_0x1 & 8) == 0) {
        ppFVar2 = &field->containing_type_->fields_;
      }
      else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar2 = &field->file_->extensions_;
      }
      else {
        ppFVar2 = &((field->scope_).extension_scope)->extensions_;
      }
      uVar5 = (ulong)((int)((ulong)((long)field - (long)*ppFVar2) >> 3) * -0x45d1745d);
      local_80.has_bit_index = -1;
      if (uVar5 < local_40) {
        local_80.has_bit_index = local_58[uVar5];
      }
      local_80.field = field;
      oVar3 = GetPresenceProbability(field,options);
      local_80.presence_probability = 0.5;
      if (((ulong)oVar3.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float> >> 0x20 & 1) != 0) {
        local_80.presence_probability =
             oVar3.super__Optional_base<float,_true,_true>._M_payload.
             super__Optional_payload_base<float>._M_payload;
      }
      local_80.lazy_opt = GetLazyStyle(field,options,scc_analyzer);
      local_80.is_string_inlined = IsStringInlined(field,options);
      local_80.is_implicitly_weak = IsImplicitWeakField(field,options,scc_analyzer);
      local_80.use_direct_tcparser_table = true;
      local_80.should_split = ShouldSplit(field,options);
      local_80.inlined_string_index = -1;
      if (uVar5 < local_48) {
        local_80.inlined_string_index = local_60[uVar5];
      }
      bVar1 = IsMicroString(field,options);
      local_80.use_micro_string = bVar1;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::FieldOptions>
                  (__return_storage_ptr__,__position,&local_80);
      }
      else {
        (__position._M_current)->lazy_opt = local_80.lazy_opt;
        (__position._M_current)->is_string_inlined = local_80.is_string_inlined;
        (__position._M_current)->is_implicitly_weak = local_80.is_implicitly_weak;
        (__position._M_current)->use_direct_tcparser_table = local_80.use_direct_tcparser_table;
        (__position._M_current)->should_split = local_80.should_split;
        *(undefined2 *)&(__position._M_current)->field_0x16 = local_80._22_2_;
        (__position._M_current)->inlined_string_index = local_80.inlined_string_index;
        (__position._M_current)->use_micro_string = bVar1;
        *(undefined3 *)&(__position._M_current)->field_0x1d = local_80._29_3_;
        (__position._M_current)->field = local_80.field;
        (__position._M_current)->has_bit_index = local_80.has_bit_index;
        (__position._M_current)->presence_probability = local_80.presence_probability;
        (__return_storage_ptr__->
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      sVar6 = sVar6 + 1;
    } while (local_50 != sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<internal::TailCallTableInfo::FieldOptions>
ParseFunctionGenerator::BuildFieldOptions(
    const Descriptor* descriptor,
    absl::Span<const FieldDescriptor* const> ordered_fields,
    const Options& options, MessageSCCAnalyzer* scc_analyzer,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices) {
  std::vector<TailCallTableInfo::FieldOptions> fields;
  fields.reserve(ordered_fields.size());
  for (size_t i = 0; i < ordered_fields.size(); ++i) {
    auto* field = ordered_fields[i];
    ABSL_CHECK_GE(field->index(), 0);
    size_t index = static_cast<size_t>(field->index());
    fields.push_back({
        field,
        index < has_bit_indices.size() ? has_bit_indices[index] : -1,
        GetPresenceProbability(field, options)
            .value_or(kUnknownPresenceProbability),
        GetLazyStyle(field, options, scc_analyzer),
        IsStringInlined(field, options),
        IsImplicitWeakField(field, options, scc_analyzer),
        /* use_direct_tcparser_table */ true,
        ShouldSplit(field, options),
        index < inlined_string_indices.size() ? inlined_string_indices[index]
                                              : -1,
        IsMicroString(field, options),
    });
  }
  return fields;
}